

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
::
AnalyzeElements<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
          *this,const_iterator elem_first,const_iterator elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  bool bVar1;
  pointer pcVar2;
  pair<const_int,_phmap::priv::NonStandardLayout> *value;
  size_t irhs;
  long lVar3;
  size_t sVar4;
  long lVar5;
  size_t num_elements;
  vector<char,_std::allocator<char>_> did_match;
  DummyMatchResultListener dummy;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(element_printouts);
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  dummy.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&PTR__MatchResultListener_002debb0;
  num_elements = 0;
  while( true ) {
    bVar1 = phmap::priv::operator!=((const_iterator *)&elem_first.iter_,&elem_last);
    if (!bVar1) break;
    if (listener->stream_ != (ostream *)0x0) {
      PrintToString<std::pair<int_const,phmap::priv::NonStandardLayout>>
                (&local_50,(testing *)elem_first.iter_.it_.field_1.slot_,value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 element_printouts,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar5 = 0;
    lVar3 = 0;
    while( true ) {
      if (lVar3 == (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18) break;
      local_50._M_dataplus._M_p._0_1_ =
           MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>::
           MatchAndExplain((MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>
                            *)(*(long *)(this + 0x28) + lVar5),
                           (pair<const_int,_phmap::priv::NonStandardLayout> *)
                           elem_first.iter_.it_.field_1.slot_,&dummy.super_MatchResultListener);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&did_match,(char *)&local_50);
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + 0x18;
    }
    num_elements = num_elements + 1;
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
    ::iterator::operator++(&elem_first.iter_);
  }
  MatchMatrix::MatchMatrix
            (__return_storage_ptr__,num_elements,
             (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18);
  pcVar2 = did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (sVar4 = 0; sVar4 != num_elements; sVar4 = sVar4 + 1) {
    for (lVar3 = 0; lVar3 != (*(long *)(this + 0x30) - *(long *)(this + 0x28)) / 0x18;
        lVar3 = lVar3 + 1) {
      (__return_storage_ptr__->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3 + __return_storage_ptr__->num_matchers_ * sVar4] =
           pcVar2[lVar3] != '\0';
    }
    pcVar2 = pcVar2 + lVar3;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&did_match.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }